

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcAlarmType::~IfcAlarmType(IfcAlarmType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)
   &this[-1].super_IfcDistributionControlElementType.super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x48 = 0x857e20;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x30 = 0x857f60;
  this[-1].super_IfcDistributionControlElementType.super_IfcDistributionElementType.
  super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.HasPropertySets.ptr.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x857e48;
  *(pointer *)
   ((long)&this[-1].super_IfcDistributionControlElementType.super_IfcDistributionElementType.
           super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.HasPropertySets.ptr + 0x10)
       = (pointer)(vtable + 0x68);
  *(undefined8 *)
   ((long)&this[-1].super_IfcDistributionControlElementType.super_IfcDistributionElementType.
           super_IfcElementType.super_IfcTypeProduct.Tag.ptr.field_2 + 8) = 0x857e98;
  *(undefined8 *)
   &this[-1].super_IfcDistributionControlElementType.super_IfcDistributionElementType.
    super_IfcElementType.field_0x190 = 0x857ec0;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x857ee8;
  *(undefined8 *)&this[-1].field_0x1d8 = 0x857f10;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject = 0x857f38;
  puVar1 = *(undefined1 **)
            &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
             super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x10;
  if (puVar1 != &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
                 super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x20) {
    operator_delete(puVar1);
  }
  *(undefined8 *)
   &this[-1].super_IfcDistributionControlElementType.super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x48 = 0x8583c0;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x30 = 0x858488;
  this[-1].super_IfcDistributionControlElementType.super_IfcDistributionElementType.
  super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.HasPropertySets.ptr.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x8583e8;
  *(pointer *)
   ((long)&this[-1].super_IfcDistributionControlElementType.super_IfcDistributionElementType.
           super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.HasPropertySets.ptr + 0x10)
       = (pointer)(IfcElementType-in-Assimp::IFC::Schema_2x3::IfcAlarmType::construction_vtable +
                  0x68);
  *(undefined8 *)
   ((long)&this[-1].super_IfcDistributionControlElementType.super_IfcDistributionElementType.
           super_IfcElementType.super_IfcTypeProduct.Tag.ptr.field_2 + 8) = 0x858438;
  *(undefined8 *)
   &this[-1].super_IfcDistributionControlElementType.super_IfcDistributionElementType.
    super_IfcElementType.field_0x190 = 0x858460;
  puVar1 = *(undefined1 **)
            &this[-1].super_IfcDistributionControlElementType.super_IfcDistributionElementType.
             field_0x1a0;
  if (puVar1 != &this[-1].super_IfcDistributionControlElementType.field_0x1b0) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)
             &this[-1].super_IfcDistributionControlElementType.super_IfcDistributionElementType.
              super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x48,
             &PTR_construction_vtable_24__00857f90);
  return;
}

Assistant:

IfcAlarmType() : Object("IfcAlarmType") {}